

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O3

void __thiscall
Context::Context(Context *this,string *logfile_name,int float_precision,
                float float_comparison_tolerance,bool is_quiet_mode)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  
  std::ofstream::ofstream(this);
  this->_float_precision = float_precision;
  this->_float_comparison_tolerance = float_comparison_tolerance;
  this->_is_quiet_mode = is_quiet_mode;
  p_Var1 = &(this->_instances)._M_t._M_impl.super__Rb_tree_header;
  (this->_instances)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_instances)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_instances)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_instances)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_instances)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar2 = std::__cxx11::string::compare((char *)logfile_name);
  if (iVar2 != 0) {
    std::ofstream::open((string *)this,(_Ios_Openmode)logfile_name);
  }
  return;
}

Assistant:

Context::Context(const std::string& logfile_name, int float_precision, float float_comparison_tolerance,
                 bool is_quiet_mode) : _float_precision(float_precision),
                                       _float_comparison_tolerance(float_comparison_tolerance),
                                       _is_quiet_mode(is_quiet_mode) {
    if (logfile_name != "")
        _logfile.open(logfile_name, std::ios::out | std::ios::app);
}